

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::ProcessParam1BeforeParam2(IntersectNode *node1,IntersectNode *node2)

{
  bool result;
  IntersectNode *node2_local;
  IntersectNode *node1_local;
  
  if ((node1->pt).Y == (node2->pt).Y) {
    if ((node1->edge1 == node2->edge1) || (node1->edge2 == node2->edge1)) {
      node1_local._7_1_ = (node1->pt).X < (node2->pt).X;
      if (0.0 < node2->edge1->dx) {
        node1_local._7_1_ = !node1_local._7_1_;
      }
    }
    else if ((node1->edge1 == node2->edge2) || (node1->edge2 == node2->edge2)) {
      node1_local._7_1_ = (node1->pt).X < (node2->pt).X;
      if (0.0 < node2->edge2->dx) {
        node1_local._7_1_ = !node1_local._7_1_;
      }
    }
    else {
      node1_local._7_1_ = (node1->pt).X < (node2->pt).X;
    }
  }
  else {
    node1_local._7_1_ = (node2->pt).Y < (node1->pt).Y;
  }
  return node1_local._7_1_;
}

Assistant:

bool ProcessParam1BeforeParam2(IntersectNode &node1, IntersectNode &node2)
{
  bool result;
  if (node1.pt.Y == node2.pt.Y)
  {
    if (node1.edge1 == node2.edge1 || node1.edge2 == node2.edge1)
    {
      result = node2.pt.X > node1.pt.X;
      return node2.edge1->dx > 0 ? !result : result;
    }
    else if (node1.edge1 == node2.edge2 || node1.edge2 == node2.edge2)
    {
      result = node2.pt.X > node1.pt.X;
      return node2.edge2->dx > 0 ? !result : result;
    }
    else return node2.pt.X > node1.pt.X;
  }
  else return node1.pt.Y > node2.pt.Y;
}